

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_object.c
# Opt level: O2

void assert_parse_object(char *json)

{
  cJSON_bool cVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  parse_buffer local_48;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.offset = 0;
  local_48.depth = 0;
  local_48.content = (uchar *)json;
  sVar2 = strlen(json);
  local_48.length = sVar2 + 1;
  local_48.hooks.allocate = global_hooks.allocate;
  local_48.hooks.deallocate = global_hooks.deallocate;
  local_48.hooks.reallocate = global_hooks.reallocate;
  cVar1 = parse_object(item,&local_48);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x48);
  }
  if (item[0].next != (cJSON *)0x0) {
    UnityFail("Linked list next pointer is not NULL.",0x25);
  }
  if (item[0].prev != (cJSON *)0x0) {
    UnityFail("Linked list previous pointer is not NULL.",0x25);
  }
  UnityAssertBits(0xff,0x40,(long)item[0].type,"Item doesn\'t have expected type.",0x26);
  UnityAssertBits(0x100,0,(long)item[0].type,"Item should not have a string as reference.",0x27);
  UnityAssertBits(0x200,0,(long)item[0].type,"Item should not have a const string.",0x28);
  if (item[0].valuestring != (char *)0x0) {
    UnityFail("Valuestring is not NULL.",0x29);
  }
  if (item[0].string != (char *)0x0) {
    UnityFail("String is not NULL.",0x2a);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void assert_parse_object(const char *json)
{
    parse_buffer parsebuffer = { 0, 0, 0, 0, { 0, 0, 0 } };
    parsebuffer.content = (const unsigned char*)json;
    parsebuffer.length = strlen(json) + sizeof("");
    parsebuffer.hooks = global_hooks;

    TEST_ASSERT_TRUE(parse_object(item, &parsebuffer));
    assert_is_object(item);
}